

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void display_img(Mat *disp)

{
  int iVar1;
  _InputArray local_60;
  allocator<char> local_31;
  string local_30 [32];
  Mat *local_10;
  Mat *disp_local;
  
  local_10 = disp;
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_30,"Current image",&local_31);
    cv::_InputArray::_InputArray(&local_60,disp);
    cv::imshow(local_30,&local_60);
    cv::_InputArray::~_InputArray(&local_60);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator(&local_31);
    iVar1 = cv::waitKey(0x1e);
  } while (iVar1 != 0x1b);
  return;
}

Assistant:

void display_img(cv::Mat disp) {
    do {
        cv::imshow("Current image", disp);
        if (cv::waitKey(30) == 27) {
            return;
        }
    } while (true);
}